

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_encoder.cc
# Opt level: O0

Status * __thiscall draco::MeshEncoder::EncodeGeometryData(MeshEncoder *this)

{
  undefined1 uVar1;
  byte bVar2;
  PointCloudEncoder *in_RSI;
  Status *in_RDI;
  Status *_local_status;
  string *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined6 in_stack_ffffffffffffffb0;
  allocator<char> in_stack_ffffffffffffffb7;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  (*in_RSI->_vptr_PointCloudEncoder[0x10])();
  uVar1 = Status::ok(in_RDI);
  if ((bool)uVar1) {
    Status::~Status((Status *)0x1abdab);
    PointCloudEncoder::options(in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (allocator<char> *)
               CONCAT17(in_stack_ffffffffffffffb7,CONCAT16(uVar1,in_stack_ffffffffffffffb0)));
    bVar2 = DracoOptions<int>::GetGlobalBool
                      ((DracoOptions<int> *)
                       CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff78,false);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    if ((bVar2 & 1) != 0) {
      (*in_RSI->_vptr_PointCloudEncoder[0x11])();
    }
    OkStatus();
  }
  return in_RDI;
}

Assistant:

Status MeshEncoder::EncodeGeometryData() {
  DRACO_RETURN_IF_ERROR(EncodeConnectivity());
  if (options()->GetGlobalBool("store_number_of_encoded_faces", false)) {
    ComputeNumberOfEncodedFaces();
  }
  return OkStatus();
}